

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O2

MPP_RET mpp_enc_refs_rollback(MppEncRefs refs)

{
  byte bVar1;
  MPP_RET MVar2;
  
  if (refs == (MppEncRefs)0x0) {
    _mpp_log_l(2,"mpp_enc_refs","invalid NULL input refs\n","mpp_enc_refs_rollback");
    MVar2 = MPP_ERR_VALUE;
  }
  else if (((byte)enc_refs_debug & 1) == 0) {
    memcpy((void *)((long)refs + 0x40),(void *)((long)refs + 0x5e8),0x5a8);
    MVar2 = MPP_OK;
  }
  else {
    MVar2 = MPP_OK;
    _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_rollback",refs);
    bVar1 = (byte)enc_refs_debug;
    memcpy((void *)((long)refs + 0x40),(void *)((long)refs + 0x5e8),0x5a8);
    if ((bVar1 & 1) != 0) {
      MVar2 = MPP_OK;
      _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_rollback",refs);
    }
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_enc_refs_rollback(MppEncRefs refs)
{
    if (NULL == refs) {
        mpp_err_f("invalid NULL input refs\n");
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    memcpy(&p->cpb, &p->cpb_stash, sizeof(p->cpb));

    enc_refs_dbg_func("leave %p\n", refs);
    return MPP_OK;
}